

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O2

void __thiscall
slang::syntax::SyntaxVisitor<slang::parsing::(anonymous_namespace)::MetadataVisitor>::
visitDefault<slang::syntax::ConcurrentAssertionStatementSyntax_const&>
          (SyntaxVisitor<slang::parsing::(anonymous_namespace)::MetadataVisitor> *this,
          ConcurrentAssertionStatementSyntax *node)

{
  size_t sVar1;
  SyntaxNode *node_00;
  uint uVar2;
  ulong index;
  Token token;
  
  uVar2 = 0;
  while( true ) {
    index = (ulong)uVar2;
    sVar1 = SyntaxNode::getChildCount((SyntaxNode *)node);
    if (sVar1 <= index) break;
    node_00 = SyntaxNode::childNode((SyntaxNode *)node,index);
    if (node_00 == (SyntaxNode *)0x0) {
      token = SyntaxNode::childToken((SyntaxNode *)node,index);
      if (token.info != (Info *)0x0) {
        parsing::anon_unknown_4::MetadataVisitor::visitToken((MetadataVisitor *)this,token);
      }
    }
    else {
      detail::
      visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::parsing::(anonymous_namespace)::MetadataVisitor>
                (node_00,(MetadataVisitor *)this);
    }
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void visitDefault(T&& node) {
        for (uint32_t i = 0; i < node.getChildCount(); i++) {
            auto child = node.childNode(i);
            if (child)
                child->visit(*DERIVED);
            else {
                auto token = node.childToken(i);
                if (token)
                    DERIVED->visitToken(token);
            }
        }
    }